

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionRayleighEasyRectangular::ChBeamSectionRayleighEasyRectangular
          (ChBeamSectionRayleighEasyRectangular *this,double mwidth_y,double mwidth_z,double mE,
          double mG,double mdensity)

{
  ChBeamSectionEulerSimple::ChBeamSectionEulerSimple((ChBeamSectionEulerSimple *)this);
  (this->super_ChBeamSectionRayleighSimple).super_ChBeamSectionEulerSimple.super_ChBeamSectionEuler.
  super_ChBeamSection._vptr_ChBeamSection = (_func_int **)&PTR__ChBeamSection_00b4e0c8;
  (this->super_ChBeamSectionRayleighSimple).super_ChBeamSectionEulerSimple.E = mE;
  (this->super_ChBeamSectionRayleighSimple).super_ChBeamSectionEulerSimple.G = mG;
  (this->super_ChBeamSectionRayleighSimple).super_ChBeamSectionEulerSimple.density = mdensity;
  ChBeamSectionEulerSimple::SetAsRectangularSection
            ((ChBeamSectionEulerSimple *)this,mwidth_y,mwidth_z);
  return;
}

Assistant:

ChBeamSectionRayleighEasyRectangular::ChBeamSectionRayleighEasyRectangular(double mwidth_y, double mwidth_z, double mE, double mG, double mdensity)
	{
		this->SetYoungModulus(mE);
		this->SetGshearModulus(mG);
		this->SetDensity(mdensity);
		this->SetAsRectangularSection(mwidth_y,mwidth_z);
	}